

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O1

bool QInternalMimeData::hasFormatHelper(QString *mimeType,QMimeData *data)

{
  char cVar1;
  char cVar2;
  undefined1 *puVar3;
  long lVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QLatin1String QVar6;
  QStringView QVar7;
  QLatin1String QVar8;
  QArrayDataPointer<QString> local_68;
  QArrayDataPointer<QByteArray> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)data + 0x60))(data,mimeType);
  if (cVar1 != '\0') goto LAB_002ef15b;
  if (((mimeType->d).size == 0x16) &&
     (QVar5.m_data = (mimeType->d).ptr, QVar5.m_size = 0x16, QVar8.m_data = "application/x-qt-image"
     , QVar8.m_size = 0x16, cVar2 = QtPrivate::equalStrings(QVar5,QVar8), cVar2 != '\0')) {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QImageWriter::supportedImageFormats();
    imageMimeFormats((QStringList *)&local_68,(QList<QByteArray> *)&local_48);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48);
    if ((undefined1 *)local_68.size != (undefined1 *)0x0) {
      lVar4 = 0;
      puVar3 = (undefined1 *)0x0;
      do {
        cVar1 = (**(code **)(*(long *)data + 0x60))
                          (data,(undefined1 *)((long)&((local_68.ptr)->d).d + lVar4));
        if (cVar1 != '\0') break;
        puVar3 = puVar3 + 1;
        lVar4 = lVar4 + 0x18;
      } while (puVar3 < (ulong)local_68.size);
    }
  }
  else {
    QVar6.m_data = &DAT_00000006;
    QVar6.m_size = (qsizetype)mimeType;
    cVar2 = QString::startsWith(QVar6,0x688f08);
    if (cVar2 == '\0') goto LAB_002ef15b;
    cVar1 = QMimeData::hasImage();
    if (cVar1 == '\0') {
      cVar1 = '\0';
      goto LAB_002ef15b;
    }
    QImageWriter::supportedImageFormats();
    imageMimeFormats((QStringList *)&local_68,(QList<QByteArray> *)&local_48);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48);
    QVar7.m_data = (mimeType->d).ptr;
    QVar7.m_size = (mimeType->d).size;
    cVar1 = QtPrivate::QStringList_contains((QList_conflict *)&local_68,QVar7,CaseSensitive);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
LAB_002ef15b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)cVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QInternalMimeData::hasFormatHelper(const QString &mimeType, const QMimeData *data)
{

    bool foundFormat = data->hasFormat(mimeType);
    if (!foundFormat) {
        if (mimeType == "application/x-qt-image"_L1) {
            // check all supported image formats
            QStringList imageFormats = imageWriteMimeFormats();
            for (int i = 0; i < imageFormats.size(); ++i) {
                if ((foundFormat = data->hasFormat(imageFormats.at(i))))
                    break;
            }
        } else if (mimeType.startsWith("image/"_L1)) {
            return data->hasImage() && imageWriteMimeFormats().contains(mimeType);
        }
    }
    return foundFormat;
}